

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void paint(WindowHandle h_wnd,uint8_t *bytes,int w,int h,int channels)

{
  bool bVar1;
  void *pvVar2;
  undefined4 local_e8;
  int res;
  XEvent ev;
  bool flip_colors;
  int iStack_20;
  bool flip_topdown;
  int channels_local;
  int h_local;
  int w_local;
  uint8_t *bytes_local;
  WindowHandle h_wnd_local;
  
  ev.pad[0x17]._4_4_ = channels;
  iStack_20 = h;
  channels_local = w;
  _h_local = bytes;
  bytes_local = (uint8_t *)h_wnd;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&h_wnd->quit);
  if (!bVar1) {
    ev.pad[0x17]._3_1_ = iStack_20 < 0;
    if ((bool)ev.pad[0x17]._3_1_) {
      iStack_20 = -iStack_20;
    }
    ev.pad[0x17]._2_1_ = (int)ev.pad[0x17]._4_4_ < 0;
    if ((bool)ev.pad[0x17]._2_1_) {
      ev.pad[0x17]._4_4_ = -ev.pad[0x17]._4_4_;
    }
    std::mutex::lock((mutex *)(bytes_local + 0x70));
    if ((*(int *)(bytes_local + 0x58) != channels_local) ||
       (*(int *)(bytes_local + 0x5c) != iStack_20)) {
      if (*(int *)(bytes_local + 0x58) == 0) {
        pvVar2 = malloc((long)channels_local * 4 * (long)iStack_20);
        *(void **)(bytes_local + 0x28) = pvVar2;
      }
      else {
        pvVar2 = realloc(*(void **)(bytes_local + 0x28),(long)channels_local * 4 * (long)iStack_20);
        *(void **)(bytes_local + 0x28) = pvVar2;
      }
    }
    *(int *)(bytes_local + 0x58) = channels_local;
    *(int *)(bytes_local + 0x5c) = iStack_20;
    *(undefined4 *)(bytes_local + 0x60) = ev.pad[0x17]._4_4_;
    anon_unknown.dwarf_113fb::_process_pixels_32
              (*(uint32_t **)(bytes_local + 0x28),_h_local,channels_local,iStack_20,
               ev.pad[0x17]._4_4_,(bool)(ev.pad[0x17]._2_1_ & 1),(bool)(ev.pad[0x17]._3_1_ & 1));
    anon_unknown.dwarf_113fb::_scale
              (*(uint32_t **)(bytes_local + 0x20),*(int *)(bytes_local + 0x38),
               *(int *)(bytes_local + 0x3c),*(uint32_t **)(bytes_local + 0x28),channels_local,
               iStack_20);
    XPutImage(*(undefined8 *)bytes_local,*(undefined8 *)(bytes_local + 0x30),
              *(undefined8 *)(bytes_local + 0x40),*(undefined8 *)(bytes_local + 0x18),0,0,0,0,
              *(undefined4 *)(bytes_local + 0x38),*(undefined4 *)(bytes_local + 0x3c));
    XFlush(*(undefined8 *)bytes_local);
    local_e8 = 0xc;
    XSendEvent(*(undefined8 *)bytes_local,*(undefined8 *)(bytes_local + 8),1,0x8000,&local_e8);
    std::mutex::unlock((mutex *)(bytes_local + 0x70));
  }
  return;
}

Assistant:

void paint(WindowHandle h_wnd, const uint8_t* bytes, int w, int h, int channels)
  {
#ifndef _WIN32
  if (h_wnd->quit)
    return;
#endif
  bool flip_topdown = false;
  if (h < 0)
    {
    flip_topdown = true;
    h = -h;
    }
  bool flip_colors = false;
  if (channels < 0)
    {
    flip_colors = true;
    channels = -channels;
    }
#ifdef _WIN32
  h_wnd->mt.lock();
  int stride = (w + 3) & ~3;
  if (h_wnd->w != w || h_wnd->h != h || h_wnd->channels != channels)
    {    
    if (h_wnd->channels == 0)
      {
      h_wnd->bytes = (uint8_t*)malloc(sizeof(uint8_t)*stride*h*channels);
      }
    else
      {
      h_wnd->bytes = (uint8_t*)realloc(h_wnd->bytes, sizeof(uint8_t)*stride*h*channels);
      }
    h_wnd->w = w;
    h_wnd->h = h;
    h_wnd->channels = channels;
    }
  _process_pixels(h_wnd->bytes, bytes, w, h, stride, channels, flip_colors, flip_topdown);
  h_wnd->mt.unlock();
  InvalidateRect(h_wnd->h_wnd, NULL, TRUE);
#else
  h_wnd->mt.lock(); 

  if (h_wnd->w != w || h_wnd->h != h)
    {
    if (h_wnd->w == 0)
      {
      h_wnd->bytes = (uint32_t*)malloc(sizeof(uint32_t)*w*h);
      }
    else
      {
      h_wnd->bytes = (uint32_t*)realloc(h_wnd->bytes, sizeof(uint32_t)*w*h);
      }
    }

  h_wnd->w = w;
  h_wnd->h = h;
  h_wnd->channels = channels;
  
  
  _process_pixels_32((uint32_t*)h_wnd->bytes, bytes, w, h, channels, flip_colors, flip_topdown);   
  
  _scale((uint32_t*)h_wnd->data, h_wnd->pix_w, h_wnd->pix_h, (uint32_t*)h_wnd->bytes, w, h);
  
  XPutImage(h_wnd->display, h_wnd->pix, h_wnd->gc, h_wnd->im, 0, 0, 0, 0, h_wnd->pix_w, h_wnd->pix_h);
  
  XFlush(h_wnd->display);
  
  XEvent ev;   
  ev.type = Expose;
  int res = XSendEvent(h_wnd->display, h_wnd->win, True, ExposureMask, (XEvent*)&ev);
  
  h_wnd->mt.unlock();
#endif
  }